

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cubeb_pulse.c
# Opt level: O0

pa_channel_position_t cubeb_channel_to_pa_channel(cubeb_channel channel)

{
  cubeb_channel channel_local;
  undefined4 local_4;
  
  if (channel == CHANNEL_FRONT_LEFT) {
    local_4 = PA_CHANNEL_POSITION_FRONT_LEFT;
  }
  else if (channel == CHANNEL_FRONT_RIGHT) {
    local_4 = PA_CHANNEL_POSITION_FRONT_RIGHT;
  }
  else if (channel == CHANNEL_FRONT_CENTER) {
    local_4 = PA_CHANNEL_POSITION_CENTER;
  }
  else if (channel == CHANNEL_LOW_FREQUENCY) {
    local_4 = PA_CHANNEL_POSITION_LFE;
  }
  else if (channel == CHANNEL_BACK_LEFT) {
    local_4 = PA_CHANNEL_POSITION_REAR_LEFT;
  }
  else if (channel == CHANNEL_BACK_RIGHT) {
    local_4 = PA_CHANNEL_POSITION_REAR_RIGHT;
  }
  else if (channel == CHANNEL_FRONT_LEFT_OF_CENTER) {
    local_4 = PA_CHANNEL_POSITION_FRONT_LEFT_OF_CENTER;
  }
  else if (channel == CHANNEL_FRONT_RIGHT_OF_CENTER) {
    local_4 = PA_CHANNEL_POSITION_FRONT_RIGHT_OF_CENTER;
  }
  else if (channel == CHANNEL_BACK_CENTER) {
    local_4 = PA_CHANNEL_POSITION_REAR_CENTER;
  }
  else if (channel == CHANNEL_SIDE_LEFT) {
    local_4 = PA_CHANNEL_POSITION_SIDE_LEFT;
  }
  else if (channel == CHANNEL_SIDE_RIGHT) {
    local_4 = PA_CHANNEL_POSITION_SIDE_RIGHT;
  }
  else if (channel == CHANNEL_TOP_CENTER) {
    local_4 = PA_CHANNEL_POSITION_TOP_CENTER;
  }
  else if (channel == CHANNEL_TOP_FRONT_LEFT) {
    local_4 = PA_CHANNEL_POSITION_TOP_FRONT_LEFT;
  }
  else if (channel == CHANNEL_TOP_FRONT_CENTER) {
    local_4 = PA_CHANNEL_POSITION_TOP_FRONT_CENTER;
  }
  else if (channel == CHANNEL_TOP_FRONT_RIGHT) {
    local_4 = PA_CHANNEL_POSITION_TOP_FRONT_RIGHT;
  }
  else if (channel == CHANNEL_TOP_BACK_LEFT) {
    local_4 = PA_CHANNEL_POSITION_TOP_REAR_LEFT;
  }
  else if (channel == CHANNEL_TOP_BACK_CENTER) {
    local_4 = PA_CHANNEL_POSITION_TOP_REAR_CENTER;
  }
  else if (channel == CHANNEL_TOP_BACK_RIGHT) {
    local_4 = PA_CHANNEL_POSITION_TOP_REAR_RIGHT;
  }
  else {
    local_4 = PA_CHANNEL_POSITION_INVALID;
  }
  return local_4;
}

Assistant:

static pa_channel_position_t
cubeb_channel_to_pa_channel(cubeb_channel channel)
{
  switch (channel) {
  case CHANNEL_FRONT_LEFT:
    return PA_CHANNEL_POSITION_FRONT_LEFT;
  case CHANNEL_FRONT_RIGHT:
    return PA_CHANNEL_POSITION_FRONT_RIGHT;
  case CHANNEL_FRONT_CENTER:
    return PA_CHANNEL_POSITION_FRONT_CENTER;
  case CHANNEL_LOW_FREQUENCY:
    return PA_CHANNEL_POSITION_LFE;
  case CHANNEL_BACK_LEFT:
    return PA_CHANNEL_POSITION_REAR_LEFT;
  case CHANNEL_BACK_RIGHT:
    return PA_CHANNEL_POSITION_REAR_RIGHT;
  case CHANNEL_FRONT_LEFT_OF_CENTER:
    return PA_CHANNEL_POSITION_FRONT_LEFT_OF_CENTER;
  case CHANNEL_FRONT_RIGHT_OF_CENTER:
    return PA_CHANNEL_POSITION_FRONT_RIGHT_OF_CENTER;
  case CHANNEL_BACK_CENTER:
    return PA_CHANNEL_POSITION_REAR_CENTER;
  case CHANNEL_SIDE_LEFT:
    return PA_CHANNEL_POSITION_SIDE_LEFT;
  case CHANNEL_SIDE_RIGHT:
    return PA_CHANNEL_POSITION_SIDE_RIGHT;
  case CHANNEL_TOP_CENTER:
    return PA_CHANNEL_POSITION_TOP_CENTER;
  case CHANNEL_TOP_FRONT_LEFT:
    return PA_CHANNEL_POSITION_TOP_FRONT_LEFT;
  case CHANNEL_TOP_FRONT_CENTER:
    return PA_CHANNEL_POSITION_TOP_FRONT_CENTER;
  case CHANNEL_TOP_FRONT_RIGHT:
    return PA_CHANNEL_POSITION_TOP_FRONT_RIGHT;
  case CHANNEL_TOP_BACK_LEFT:
    return PA_CHANNEL_POSITION_TOP_REAR_LEFT;
  case CHANNEL_TOP_BACK_CENTER:
    return PA_CHANNEL_POSITION_TOP_REAR_CENTER;
  case CHANNEL_TOP_BACK_RIGHT:
    return PA_CHANNEL_POSITION_TOP_REAR_RIGHT;
  default:
    return PA_CHANNEL_POSITION_INVALID;
  }
}